

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::MultiNodeChain<QByteArray>::~MultiNodeChain(MultiNodeChain<QByteArray> *this)

{
  QByteArray::~QByteArray((QByteArray *)0x1de3d2);
  return;
}

Assistant:

qsizetype free() noexcept(std::is_nothrow_destructible_v<T>)
    {
        qsizetype nEntries = 0;
        MultiNodeChain *e = this;
        while (e) {
            MultiNodeChain *n = e->next;
            ++nEntries;
            delete e;
            e = n;
        }
        return  nEntries;
    }